

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O2

bool __thiscall PhyloTreeEdge::sameBipartition(PhyloTreeEdge *this,Bipartition *bip)

{
  bool bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  Bipartition::getPartition(&local_30,bip);
  bVar1 = boost::operator==(&(this->super_Bipartition).partition,&local_30);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_30);
  return bVar1;
}

Assistant:

bool PhyloTreeEdge::sameBipartition(const Bipartition &bip) const {
    return partition == bip.getPartition();
}